

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O2

void __thiscall asl::IniFile::IniFile(IniFile *this,String *fname,bool shouldwrite)

{
  String *this_00;
  Array<asl::String> *this_01;
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  String *pSVar7;
  String *pSVar8;
  undefined8 uVar9;
  Dic<asl::String> *pDVar10;
  char *pcVar11;
  int j;
  long lVar12;
  String line;
  Map<asl::String,_asl::String> *local_b8;
  String name;
  String value;
  TextFile file;
  
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *)this);
  this_00 = &this->_currentTitle;
  (this->_currentTitle)._size = 0;
  (this->_currentTitle)._len = 0;
  (this->_currentTitle).field_2._space[0] = '\0';
  (this->_filename)._size = 0;
  (this->_filename)._len = 0;
  (this->_filename).field_2._space[0] = '\0';
  (this->_indent).field_2._space[0] = '\0';
  (this->_indent)._size = 0;
  (this->_indent)._len = 0;
  this_01 = &this->_lines;
  Array<asl::String>::Array(this_01);
  this->_modified = false;
  String::operator=(&this->_filename,fname);
  String::operator=(this_00,"-");
  this->_ok = false;
  this->_shouldwrite = shouldwrite;
  TextFile::TextFile(&file,fname,READ);
  if (file.super_File._file != (FILE *)0x0) {
    Array<asl::String>::reserve(this_01,0x10);
    this->_ok = true;
    String::String(&line,"-");
    local_b8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&line)->
                super_Map<asl::String,_asl::String>;
    String::~String(&line);
    do {
      bVar3 = TextFile::end(&file);
      if (bVar3) break;
      TextFile::readLine(&line,&file);
      if (shouldwrite) {
        Array<asl::String>::operator<<(this_01,&line);
      }
      if (line._len < 1) {
LAB_00133d96:
        bVar3 = false;
      }
      else {
        bVar4 = TextFile::end(&file);
        bVar3 = true;
        if (!bVar4) {
          uVar9 = &line.field_2;
          uVar6 = &line.field_2;
          if (line._size != 0) {
            uVar9 = line.field_2._str;
            uVar6 = line.field_2._str;
          }
          while( true ) {
            bVar1 = *(byte *)uVar9;
            if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
               ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
            uVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(uVar9 + 1);
          }
          if (*(char *)uVar6 == '[') {
            iVar5 = String::indexOf(&line,']',1);
            if (-1 < iVar5) {
              String::substring(&name,&line,1,iVar5);
              local_b8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                                    ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&name)->
                          super_Map<asl::String,_asl::String>;
              bVar3 = String::operator==(this_00,"-");
              if (bVar3) {
                String::operator=(this_00,&name);
              }
LAB_00133d8c:
              String::~String(&name);
            }
          }
          else if (bVar1 != 0x3b && '/' < (char)bVar1) {
            iVar5 = String::indexOf(&line,'=',0);
            if (0 < iVar5) {
              if ((this->_indent)._len < 1) {
                for (lVar12 = 0; lVar12 < line._len; lVar12 = lVar12 + 1) {
                  uVar9 = &line.field_2;
                  if (line._size != 0) {
                    uVar9 = line.field_2._str;
                  }
                  bVar1 = *(byte *)(uVar9 + lVar12);
                  if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
                     ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) break;
                  String::operator+=(&this->_indent,bVar1);
                }
              }
              String::substring(&name,&line,0,iVar5);
              String::substring(&value,&line,iVar5 + 1);
              pSVar7 = String::trim(&value);
              pSVar8 = String::trim(&name);
              pSVar8 = String::replaceme(pSVar8,'/','\\');
              pSVar8 = Map<asl::String,_asl::String>::operator[](local_b8,pSVar8);
              String::operator=(pSVar8,pSVar7);
              String::~String(&value);
              goto LAB_00133d8c;
            }
            iVar5 = *(int *)&this_01->_a[-1].field_2;
            if ((0 < (long)iVar5) && (0 < this_01->_a[(long)iVar5 + -1]._len)) {
              Array<asl::String>::resize(this_01,iVar5 + -1);
            }
          }
          goto LAB_00133d96;
        }
      }
      String::~String(&line);
    } while (!bVar3);
    uVar2 = *(uint *)&this_01->_a[-1].field_2;
    iVar5 = uVar2 + 1;
    lVar12 = (ulong)uVar2 * 0x18 + -0x10;
    while (iVar5 = iVar5 + -1, 1 < iVar5) {
      pSVar7 = this_01->_a;
      if (*(int *)((long)pSVar7 + lVar12 + -8) == 0) {
        pcVar11 = (char *)((long)&pSVar7->_size + lVar12);
      }
      else {
        pcVar11 = *(char **)((long)&pSVar7->_size + lVar12);
      }
      if (*pcVar11 != '\0') break;
      lVar12 = lVar12 + -0x18;
      Array<asl::String>::resize(this_01,*(int *)&pSVar7[-1].field_2 + -1);
    }
    String::String(&line,"-");
    pDVar10 = Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&line);
    iVar5 = *(int *)&(pDVar10->super_Map<asl::String,_asl::String>).a._a[-1].value.field_2;
    String::~String(&line);
    if (iVar5 == 0) {
      String::String(&line,"-");
      Map<asl::String,_asl::Dic<asl::String>_>::remove
                ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(char *)&line);
      String::~String(&line);
    }
    else {
      String::operator=(this_00,"-");
    }
  }
  File::~File(&file.super_File);
  return;
}

Assistant:

IniFile::IniFile(const String& fname, bool shouldwrite)
{
	_modified = false;
	_filename = fname;
	_currentTitle = NOSECTION;
	_ok = false;
	_shouldwrite = shouldwrite;
	TextFile file(fname, File::READ);
	if(!file) {
		return;
	}
	_lines.reserve(16);
	_ok = true;
	Section* cursection = &_sections[NOSECTION];
	while(!file.end())
	{
		String line=file.readLine();
		if (shouldwrite)
			_lines << line;
		if(!line.ok())
			continue;
		if(file.end())
			break;

		int i0 = 0;
		while (myisspace(line[i0]) && line[i0] != '\0')
			i0++;

		if (line[0] == '[')
		{
			int end = line.indexOf(']', 1);
			if(end < 0)
				continue;
			String name = line.substring(1, end);
			cursection = &_sections[name];
			if (_currentTitle == NOSECTION)
				_currentTitle = name;
		}
		else if(line[i0] != '#' && line[i0] > 47 && line[i0] != ';')
		{
			int i = line.indexOf('=');
			if (i < 1)
			{
				if (_lines.length() > 0 && _lines.last().ok())
					_lines.resize(_lines.length() - 1);
				continue;
			}
			if (!_indent.ok())
				for (int j = 0; j < line.length(); j++)
				{
					if (myisspace(line[j]))
						_indent += line[j];
					else
						break;
				}
			String key = line.substring(0,i);
			String value = line.substring(i+1);
			(*cursection)[key.trim().replaceme('/', '\\')] = value.trim();
		}
	}
	
	for(int i=_lines.length()-1; i>0 && _lines[i][0] == '\0'; i--)
	{
		_lines.resize(_lines.length()-1);
	}
	if (_sections[NOSECTION].length() == 0)
		_sections.remove(NOSECTION);
	else
		_currentTitle = NOSECTION;
}